

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true> __thiscall
duckdb::MultiFileReader::CreateDefault(MultiFileReader *this,string *function_name)

{
  _func_int **pp_Var1;
  pointer pMVar2;
  pointer *__ptr;
  
  pp_Var1 = (_func_int **)operator_new(0x28);
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__MultiFileReader_0198dca8;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
  this->_vptr_MultiFileReader = pp_Var1;
  pMVar2 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pMVar2->function_name);
  return (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)
         (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)this;
}

Assistant:

unique_ptr<MultiFileReader> MultiFileReader::CreateDefault(const string &function_name) {
	auto res = make_uniq<MultiFileReader>();
	res->function_name = function_name;
	return res;
}